

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O0

int SUNLinSolFree(SUNLinearSolver S)

{
  long *in_RDI;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = 0;
  }
  else if ((in_RDI[1] == 0) || (*(long *)(in_RDI[1] + 0x70) == 0)) {
    if (*in_RDI != 0) {
      free((void *)*in_RDI);
      *in_RDI = 0;
    }
    if (in_RDI[1] != 0) {
      free((void *)in_RDI[1]);
      in_RDI[1] = 0;
    }
    free(in_RDI);
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(in_RDI[1] + 0x70))(in_RDI);
  }
  return local_4;
}

Assistant:

int SUNLinSolFree(SUNLinearSolver S)
{
  if (S == NULL) return SUNLS_SUCCESS;

  /* if the free operation exists use it */
  if (S->ops)
    if (S->ops->free) return(S->ops->free(S));

  /* if we reach this point, either ops == NULL or free == NULL,
     try to cleanup by freeing the content, ops, and solver */
  if (S->content) { free(S->content); S->content = NULL; }
  if (S->ops) { free(S->ops); S->ops = NULL; }
  free(S); S = NULL;

  return(SUNLS_SUCCESS);
}